

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

SampledSpectrum
pbrt::ConnectBDPT(Integrator *integrator,SampledWavelengths *lambda,Vertex *lightVertices,
                 Vertex *cameraVertices,int s,int t,LightSamplerHandle *lightSampler,
                 CameraHandle *camera,SamplerHandle *sampler,optional<pbrt::Point2<float>_> *pRaster
                 ,Float *misWeightPtr)

{
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  this;
  Vertex *pVVar1;
  long *plVar2;
  float fVar3;
  Interval<float> IVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Tuple2<pbrt::Point2,_float> TVar14;
  Tuple2<pbrt::Point2,_float> TVar15;
  Tuple2<pbrt::Point2,_float> TVar16;
  Tuple2<pbrt::Point2,_float> TVar17;
  bool bVar18;
  byte bVar19;
  int iVar20;
  SurfaceInteraction *pSVar21;
  Normal3f *pNVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  sampler_00;
  long lVar26;
  ulong uVar27;
  Vertex *pVVar28;
  DebugMLTSampler *pDVar29;
  long in_FS_OFFSET;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  Float FVar32;
  float fVar33;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined8 uVar34;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar38 [64];
  undefined1 auVar62 [56];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  float extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar50 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar59 [64];
  undefined1 extraout_var_15 [56];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined4 uVar63;
  undefined8 uVar64;
  undefined1 auVar73 [56];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 in_ZMM2 [64];
  undefined1 auVar74 [16];
  SampledSpectrum SVar75;
  optional<pbrt::SampledLight> sampledLight;
  RNG rng_1;
  RNG rng;
  optional<pbrt::CameraWiSample> cs;
  undefined1 local_3e8 [4];
  float afStack_3e4 [3];
  SampledWavelengths *local_3d8;
  DispatchSplit<9> local_3c9;
  Integrator *local_3c8;
  Vertex *local_3c0;
  undefined1 local_3b8 [16];
  undefined8 local_3a8;
  undefined1 local_398 [4];
  undefined1 auStack_394 [8];
  float fStack_38c;
  long local_380;
  undefined8 local_378;
  float local_370;
  float local_36c;
  float local_368;
  float fStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  Vertex *local_350;
  undefined1 local_348 [8];
  undefined8 uStack_340;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  Float FStack_32c;
  float fStack_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined4 uStack_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  Interval<float> local_2f8;
  Interval<float> IStack_2f0;
  Vertex *local_2e8;
  undefined4 local_2dc;
  RNG local_2d8;
  undefined8 *puStack_2c8;
  undefined4 *puStack_2c0;
  Float local_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_2a8;
  TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
  local_2a0;
  undefined8 local_298;
  anon_struct_8_0_00000001_for___align local_290;
  undefined1 local_288 [120];
  Interaction local_210;
  bool local_1c0;
  undefined1 local_1b8 [24];
  anon_union_248_3_83785cfc_for_Vertex_2 local_1a0;
  BxDFHandle local_a0;
  undefined1 local_98 [16];
  undefined8 uStack_88;
  Tuple3<pbrt::Vector3,_float> TStack_80;
  undefined1 local_74 [16];
  undefined8 local_64;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined1 auVar51 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  undefined1 auVar69 [64];
  
  TVar17.y = (float)local_348._4_4_;
  TVar17.x = (float)local_348._0_4_;
  uVar64 = 0;
  _local_3e8 = ZEXT816(0);
  if ((s != 0 && 1 < t) && (cameraVertices[(ulong)(uint)t - 1].type == Light)) {
    uVar34 = 0;
    goto LAB_00442327;
  }
  local_1b8._4_16_ = ZEXT816(0);
  local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = 0.0;
  local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = 0.0;
  local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = 0.0;
  local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = 0.0;
  local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = 0.0;
  local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = 0.0;
  local_1a0.ei.super_Interaction.time = 0.0;
  local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
  local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
  local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  local_1a0.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x = 0.0;
  local_1a0.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y = 0.0;
  local_1a0._60_4_ = 0;
  local_1a0.ei.super_Interaction.mediumInterface = (MediumInterface *)0x0;
  local_1a0.ei.super_Interaction.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (MediumHandle)
          (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )0x0;
  local_1a0.ei.field_0 = (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)0x0;
  local_a0.
  super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
  .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
           )0;
  local_98._0_4_ = 1.0;
  local_98._4_4_ = 0.0;
  local_98._8_4_ = 0.0;
  local_98._12_4_ = 0.0;
  uStack_88._0_4_ = 1.0;
  uStack_88._4_4_ = 0.0;
  TStack_80.x = 0.0;
  TStack_80.y = 0.0;
  TStack_80.z = 1.0;
  local_64._0_4_ = 0.0;
  local_64._4_4_ = 0.0;
  local_74._0_5_ = 0;
  local_74._5_3_ = 0;
  local_74._8_4_ = 0.0;
  local_74[0xc] = false;
  local_3d8 = lambda;
  local_3c8 = integrator;
  local_3c0 = cameraVertices;
  local_350 = lightVertices;
  if (s == 0) {
    if ((cameraVertices[(long)t + -1].type != Light) &&
       ((uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340),
        cameraVertices[(long)t + -1].type != Surface ||
        (local_348 = (undefined1  [8])TVar17,
        uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340),
        (cameraVertices[(long)t + -1].field_2.si.areaLight.
         super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
         .bits & 0xffffffffffff) == 0)))) goto LAB_004421fe;
    auVar62 = ZEXT856(0);
    auVar73 = ZEXT856(0);
    SVar75 = Vertex::Le(cameraVertices + (long)t + -1,&integrator->infiniteLights,
                        cameraVertices + (long)t + -2,lambda);
    auVar65._0_8_ = SVar75.values.values._8_8_;
    auVar65._8_56_ = auVar73;
    auVar39._0_8_ = SVar75.values.values._0_8_;
    auVar39._8_56_ = auVar62;
    auVar30 = vmovlhps_avx(auVar39._0_16_,auVar65._0_16_);
    local_3e8 = (undefined1  [4])
                (auVar30._0_4_ * cameraVertices[(long)t + -1].beta.values.values[0]);
    afStack_3e4[0] = auVar30._4_4_ * cameraVertices[(long)t + -1].beta.values.values[1];
    afStack_3e4[1] = auVar30._8_4_ * cameraVertices[(long)t + -1].beta.values.values[2];
    afStack_3e4[2] = auVar30._12_4_ * cameraVertices[(long)t + -1].beta.values.values[3];
LAB_004421f8:
  }
  else if (t == 1) {
    pVVar1 = lightVertices + (long)s + -1;
    bVar18 = Vertex::IsConnectible(pVVar1);
    pVVar28 = local_350;
    uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
    if (bVar18) {
      uVar24 = (sampler->
               super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
               ).bits;
      _local_398 = (Interaction *)&local_350[(long)s + -1].field_2;
      uVar23 = (uint)(ushort)(uVar24 >> 0x30);
      if (uVar24 >> 0x30 < 5) {
        if (uVar23 < 3) {
          if (uVar23 == 2) {
            auVar38._0_8_ =
                 PaddedSobolSampler::Get2D((PaddedSobolSampler *)(uVar24 & 0xffffffffffff));
            auVar38._8_56_ = extraout_var_01;
            auVar30 = auVar38._0_16_;
          }
          else {
            auVar46._0_8_ = HaltonSampler::Get2D((HaltonSampler *)(uVar24 & 0xffffffffffff));
            auVar46._8_56_ = extraout_var_05;
            auVar30 = auVar46._0_16_;
          }
        }
        else if ((uVar23 & 6) == 2) {
          auVar44._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar24 & 0xffffffffffff));
          auVar44._8_56_ = extraout_var_03;
          auVar30 = auVar44._0_16_;
        }
        else {
          auVar49._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar24 & 0xffffffffffff));
          auVar49._8_56_ = extraout_var_08;
          auVar30 = auVar49._0_16_;
        }
      }
      else {
        uVar23 = uVar23 - 4;
        if (uVar23 < 3) {
          if (uVar23 == 2) {
            auVar43._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)(uVar24 & 0xffffffffffff))
            ;
            auVar43._8_56_ = extraout_var_02;
            auVar30 = auVar43._0_16_;
          }
          else {
            auVar48._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar24 & 0xffffffffffff));
            auVar48._8_56_ = extraout_var_07;
            auVar30 = auVar48._0_16_;
          }
        }
        else {
          pDVar29 = (DebugMLTSampler *)(uVar24 & 0xffffffffffff);
          if ((uVar23 & 0x7ffffffe) == 2) {
            auVar45._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar29);
            auVar45._8_56_ = extraout_var_04;
            auVar30 = auVar45._0_16_;
          }
          else {
            local_368 = DebugMLTSampler::Get1D(pDVar29);
            fStack_364 = extraout_XMM0_Db;
            uStack_360 = extraout_XMM0_Dc;
            uStack_35c = extraout_XMM0_Dd;
            auVar50._0_4_ = DebugMLTSampler::Get1D(pDVar29);
            auVar50._4_60_ = extraout_var;
            auVar8._4_4_ = fStack_364;
            auVar8._0_4_ = local_368;
            auVar8._8_4_ = uStack_360;
            auVar8._12_4_ = uStack_35c;
            auVar30 = vinsertps_avx(auVar8,auVar50._0_16_,0x10);
          }
        }
      }
      uVar64 = vmovlps_avx(auVar30);
      local_348._0_4_ = (undefined4)uVar64;
      local_348._4_4_ = (undefined4)((ulong)uVar64 >> 0x20);
      CameraHandle::SampleWi
                ((optional<pbrt::CameraWiSample> *)local_288,camera,_local_398,(Point2f *)local_348,
                 local_3d8);
      uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
      if (local_1c0 == true) {
        if (pRaster->set == true) {
          pRaster->set = false;
        }
        pRaster->optionalValue =
             (aligned_storage_t<sizeof(pbrt::Point2<float>),_alignof(pbrt::Point2<float>)>)
             local_288._32_8_;
        pRaster->set = true;
        auVar12._8_8_ = local_288._8_8_;
        auVar12._0_8_ = local_288._0_8_;
        auVar5._4_4_ = local_288._28_4_;
        auVar5._0_4_ = local_288._28_4_;
        auVar5._8_4_ = local_288._28_4_;
        auVar5._12_4_ = local_288._28_4_;
        local_1b8._4_16_ = vdivps_avx512vl(auVar12,auVar5);
        local_1a0.ei.field_0 =
             (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)
             (camera->
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             ).bits;
        local_74._8_4_ = 0.0;
        local_74[0xc] = false;
        local_74._0_5_ = 0;
        local_74._5_3_ = 0;
        local_1b8._0_4_ = Camera;
        uStack_304 = SUB84(local_210.mediumInterface,0);
        uStack_300 = (undefined4)((ulong)local_210.mediumInterface >> 0x20);
        local_348._4_4_ =
             local_210.pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
        uStack_340._0_4_ =
             local_210.pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
        uStack_340._4_4_ =
             local_210.pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
        fStack_338 = local_210.pi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
        fStack_334 = local_210.pi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
        fStack_330 = local_210.pi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
        FStack_32c = local_210.time;
        fStack_328 = local_210.wo.super_Tuple3<pbrt::Vector3,_float>.x;
        fStack_324 = local_210.wo.super_Tuple3<pbrt::Vector3,_float>.y;
        fStack_320 = local_210.wo.super_Tuple3<pbrt::Vector3,_float>.z;
        fStack_31c = local_210.n.super_Tuple3<pbrt::Normal3,_float>.x;
        fStack_318 = local_210.n.super_Tuple3<pbrt::Normal3,_float>.y;
        fStack_314 = local_210.n.super_Tuple3<pbrt::Normal3,_float>.z;
        fStack_310 = local_210.uv.super_Tuple2<pbrt::Point2,_float>.x;
        fStack_30c = local_210.uv.super_Tuple2<pbrt::Point2,_float>.y;
        uStack_308 = local_210._60_4_;
        local_1a0._64_8_ = local_210.mediumInterface;
        local_1b8._20_4_ = local_348._0_4_;
        local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)local_348._4_4_;
        local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = (float)uStack_340;
        local_1a0.ei.super_Interaction.medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (MediumHandle)
                (MediumHandle)
                local_210.medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                .bits;
        local_a0.
        super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
        .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                 )0;
        local_98._0_4_ = 1.0;
        local_98._4_4_ = 0.0;
        local_98._8_4_ = 0.0;
        local_98._12_4_ = 0.0;
        uStack_88._0_4_ = 1.0;
        uStack_88._4_4_ = 0.0;
        TStack_80.x = 0.0;
        TStack_80.y = 0.0;
        TStack_80.z = 1.0;
        local_64._0_4_ = 0.0;
        local_64._4_4_ = 0.0;
        auVar62 = ZEXT856(0);
        auVar73 = ZEXT856((ulong)local_210.pi.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z);
        local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = uStack_340._4_4_;
        local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = fStack_338;
        local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = fStack_334;
        local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = fStack_330;
        local_1a0.ei.super_Interaction.time = FStack_32c;
        local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = fStack_328;
        local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = fStack_324;
        local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = fStack_320;
        local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = fStack_31c;
        local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = fStack_318;
        local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = fStack_314;
        local_1a0.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x = fStack_310;
        local_1a0.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y = fStack_30c;
        local_1a0._60_4_ = uStack_308;
        SVar75 = Vertex::f(pVVar1,(Vertex *)local_1b8,Importance);
        TVar14.y = (float)local_348._4_4_;
        TVar14.x = (float)local_348._0_4_;
        auVar69._0_8_ = SVar75.values.values._8_8_;
        auVar69._8_56_ = auVar73;
        auVar51._0_8_ = SVar75.values.values._0_8_;
        auVar51._8_56_ = auVar62;
        auVar30 = vmovlhps_avx(auVar51._0_16_,auVar69._0_16_);
        fVar33 = auVar30._0_4_ * pVVar28[(long)s + -1].beta.values.values[0] *
                 (float)local_1b8._4_4_;
        afStack_3e4[0] =
             auVar30._4_4_ * pVVar28[(long)s + -1].beta.values.values[1] * (float)local_1b8._8_4_;
        afStack_3e4[1] =
             auVar30._8_4_ * pVVar28[(long)s + -1].beta.values.values[2] * (float)local_1b8._12_4_;
        afStack_3e4[2] =
             auVar30._12_4_ * pVVar28[(long)s + -1].beta.values.values[3] * (float)local_1b8._16_4_;
        local_3e8 = (undefined1  [4])fVar33;
        if ((((pVVar28[(long)s + -1].field_2.ei.super_Interaction.n.
               super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
             (fVar3 = pVVar28[(long)s + -1].field_2.ei.super_Interaction.n.
                      super_Tuple3<pbrt::Normal3,_float>.y, fVar3 != 0.0)) || (NAN(fVar3))) ||
           ((fVar3 = pVVar28[(long)s + -1].field_2.ei.super_Interaction.n.
                     super_Tuple3<pbrt::Normal3,_float>.z, fVar3 != 0.0 || (NAN(fVar3))))) {
          if (local_1c0 == false) {
            LogFatal<char_const(&)[4]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                       ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
          }
          pNVar22 = &(pVVar1->field_2).ei.super_Interaction.n;
          if (pVVar1->type == Surface) {
            pNVar22 = (Normal3f *)((pVVar1->field_2).mi.sigma_maj.values.values + 2);
          }
          fVar3 = (pNVar22->super_Tuple3<pbrt::Normal3,_float>).z;
          auVar74 = ZEXT416((uint)(fVar3 * (float)local_288._24_4_));
          auVar30 = vfmadd132ss_fma(ZEXT416((uint)(pNVar22->super_Tuple3<pbrt::Normal3,_float>).y),
                                    auVar74,ZEXT416((uint)local_288._20_4_));
          auVar74 = vfmsub213ss_fma(ZEXT416((uint)local_288._24_4_),ZEXT416((uint)fVar3),auVar74);
          auVar30 = vfmadd231ss_fma(ZEXT416((uint)(auVar30._0_4_ + auVar74._0_4_)),
                                    ZEXT416((uint)(pNVar22->super_Tuple3<pbrt::Normal3,_float>).x),
                                    ZEXT416((uint)local_288._16_4_));
          uVar63 = auVar30._0_4_;
          auVar35._4_4_ = uVar63;
          auVar35._0_4_ = uVar63;
          auVar35._8_4_ = uVar63;
          auVar35._12_4_ = uVar63;
          auVar6._8_4_ = 0x7fffffff;
          auVar6._0_8_ = 0x7fffffff7fffffff;
          auVar6._12_4_ = 0x7fffffff;
          auVar30 = vandps_avx512vl(auVar35,auVar6);
          fVar33 = auVar30._0_4_ * fVar33;
          afStack_3e4[0] = auVar30._4_4_ * afStack_3e4[0];
          local_3e8 = (undefined1  [4])fVar33;
          afStack_3e4[1] = auVar30._8_4_ * afStack_3e4[1];
          afStack_3e4[2] = auVar30._12_4_ * afStack_3e4[2];
        }
        if ((fVar33 == 0.0) && (!NAN(fVar33))) {
          uVar24 = 0xffffffffffffffff;
          do {
            uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
            if (uVar24 == 2) goto LAB_004421fe;
            lVar26 = uVar24 * 4;
            uVar24 = uVar24 + 1;
          } while ((*(float *)(local_3e8 + lVar26 + 8) == 0.0) &&
                  (!NAN(*(float *)(local_3e8 + lVar26 + 8))));
          local_348 = (undefined1  [8])TVar14;
          uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
          if (2 < uVar24) goto LAB_004421fe;
        }
        if (local_1c0 == false) {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x2fac58d);
        }
        uVar27 = 0x13745e0cb198fe90;
        lVar26 = 0;
        uStack_308 = SUB84(local_210.mediumInterface,0);
        uStack_304 = (undefined4)((ulong)local_210.mediumInterface >> 0x20);
        local_348._0_4_ =
             local_210.pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
        local_348._4_4_ =
             local_210.pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
        uStack_340._0_4_ =
             local_210.pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
        uStack_340._4_4_ =
             local_210.pi.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
        fStack_338 = local_210.pi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
        fStack_334 = local_210.pi.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
        fStack_330 = local_210.time;
        FStack_32c = local_210.wo.super_Tuple3<pbrt::Vector3,_float>.x;
        fStack_328 = local_210.wo.super_Tuple3<pbrt::Vector3,_float>.y;
        fStack_324 = local_210.wo.super_Tuple3<pbrt::Vector3,_float>.z;
        fStack_320 = local_210.n.super_Tuple3<pbrt::Normal3,_float>.x;
        fStack_31c = local_210.n.super_Tuple3<pbrt::Normal3,_float>.y;
        fStack_318 = local_210.n.super_Tuple3<pbrt::Normal3,_float>.z;
        fStack_314 = local_210.uv.super_Tuple2<pbrt::Point2,_float>.x;
        fStack_310 = local_210.uv.super_Tuple2<pbrt::Point2,_float>.y;
        fStack_30c = local_210._60_4_;
        uStack_300 = (undefined4)
                     local_210.medium.
                     super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                     .bits;
        uStack_2fc = local_210.medium.
                     super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                     .bits._4_4_;
        uVar24 = (((ulong)(local_288._32_8_ * -0x395b586ca42e166b) >> 0x2f ^
                  local_288._32_8_ * -0x395b586ca42e166b) * -0x395b586ca42e166b ^ 0x35253c9ade8f4ca8
                 ) * -0x395b586ca42e166b;
        uVar24 = (uVar24 >> 0x2f ^ uVar24) * -0x395b586ca42e166b;
        do {
          plVar2 = (long *)(local_348 + lVar26);
          lVar26 = lVar26 + 8;
          uVar27 = (uVar27 ^ ((ulong)(*plVar2 * -0x395b586ca42e166b) >> 0x2f ^
                             *plVar2 * -0x395b586ca42e166b) * -0x395b586ca42e166b) *
                   -0x395b586ca42e166b;
        } while (lVar26 != 0x50);
        uVar24 = uVar24 >> 0x2f ^ uVar24;
        local_2d8.inc = uVar24 * 2 + 1;
        uVar27 = (uVar27 >> 0x2f ^ uVar27) * -0x395b586ca42e166b;
        local_2d8.state =
             ((uVar27 >> 0x2f ^ uVar27) + 1) * 0x5851f42d4c957f2d + uVar24 * -0x4f5c17a566d501a4 + 1
        ;
        auVar62 = ZEXT856((ulong)local_210.pi.super_Point3<pbrt::Interval<float>_>.
                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y);
        auVar73 = ZEXT856(0);
        SVar75 = Integrator::Tr(local_3c8,(Interaction *)(local_288 + 0x28),&local_210,local_3d8,
                                &local_2d8);
        auVar70._0_8_ = SVar75.values.values._8_8_;
        auVar70._8_56_ = auVar73;
        auVar74 = auVar70._0_16_;
        auVar52._0_8_ = SVar75.values.values._0_8_;
        auVar52._8_56_ = auVar62;
        auVar30 = auVar52._0_16_;
LAB_004421ee:
        auVar30 = vmovlhps_avx(auVar30,auVar74);
        local_3e8 = (undefined1  [4])(auVar30._0_4_ * (float)local_3e8);
        afStack_3e4[0] = auVar30._4_4_ * afStack_3e4[0];
        afStack_3e4[1] = auVar30._8_4_ * afStack_3e4[1];
        afStack_3e4[2] = auVar30._12_4_ * afStack_3e4[2];
        goto LAB_004421f8;
      }
    }
  }
  else if (s == 1) {
    pVVar1 = cameraVertices + (long)t + -1;
    auVar30 = in_ZMM2._0_16_;
    bVar18 = Vertex::IsConnectible(pVVar1);
    uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
    if (bVar18) {
      local_288._0_8_ =
           (sampler->
           super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
           ).bits;
      FVar32 = detail::DispatchSplit<8>::operator()
                         ((DispatchSplit<8> *)local_348,local_288,(ulong)local_288._0_8_ >> 0x30);
      pVVar28 = local_3c0;
      uVar24 = (lightSampler->
               super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
               ).bits;
      if ((ushort)(uVar24 >> 0x30) < 3) {
        if ((uVar24 & 0x3000000000000) != 0x2000000000000) {
LAB_00441d2f:
          lVar26 = *(long *)((uVar24 & 0xffffffffffff) + 0x18);
          if (lVar26 != 0) {
            auVar30 = vcvtusi2ss_avx512f(auVar30,lVar26);
            iVar20 = (int)lVar26 + -1;
            fVar33 = auVar30._0_4_;
            if ((int)(FVar32 * fVar33) <= iVar20) {
              iVar20 = (int)(FVar32 * fVar33);
            }
            lVar26 = *(long *)((uVar24 & 0xffffffffffff) + 8);
            goto LAB_00441d59;
          }
LAB_00441d7a:
          local_3b8._0_12_ = ZEXT412(0);
          local_3b8._12_4_ = 0;
          local_3a8._0_1_ = false;
          local_3a8._1_7_ = 0;
          bVar19 = false;
          goto LAB_00441d8f;
        }
        PowerLightSampler::Sample
                  ((optional<pbrt::SampledLight> *)local_3b8,
                   (PowerLightSampler *)(uVar24 & 0xffffffffffff),FVar32);
        bVar19 = local_3a8._0_1_;
      }
      else {
        if ((uVar24 & 0xfffe000000000000) != 0x2000000000000) goto LAB_00441d2f;
        lVar26 = *(long *)((uVar24 & 0xffffffffffff) + 0x20);
        if (lVar26 == 0) goto LAB_00441d7a;
        auVar30 = vcvtusi2ss_avx512f(auVar30,lVar26);
        iVar20 = (int)lVar26 + -1;
        fVar33 = auVar30._0_4_;
        if ((int)(FVar32 * fVar33) <= iVar20) {
          iVar20 = (int)(FVar32 * fVar33);
        }
        lVar26 = *(long *)((uVar24 & 0xffffffffffff) + 0x10);
LAB_00441d59:
        bVar19 = true;
        local_3b8._8_4_ = 1.0 / fVar33;
        local_3b8._0_8_ = *(undefined8 *)(lVar26 + (long)iVar20 * 8);
LAB_00441d8f:
        local_3a8._0_1_ = (bool)bVar19;
      }
      uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
      if ((bVar19 & 1) != 0) {
        uVar64 = local_3b8._0_8_;
        local_36c = (float)local_3b8._8_4_;
        local_2e8 = pVVar1;
        if ((((pVVar28[(long)t + -1].field_2.ei.super_Interaction.n.
               super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
             (fVar33 = pVVar28[(long)t + -1].field_2.ei.super_Interaction.n.
                       super_Tuple3<pbrt::Normal3,_float>.y, fVar33 != 0.0)) || (NAN(fVar33))) ||
           ((fVar33 = pVVar28[(long)t + -1].field_2.ei.super_Interaction.n.
                      super_Tuple3<pbrt::Normal3,_float>.z, fVar33 != 0.0 || (NAN(fVar33))))) {
          pSVar21 = Interaction::AsSurface(&pVVar28[(long)t + -1].field_2.ei.super_Interaction);
          local_2f8 = (pSVar21->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
          IStack_2f0 = (pSVar21->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
          local_370 = (pSVar21->shading).n.super_Tuple3<pbrt::Normal3,_float>.z;
          local_380._0_4_ = (pSVar21->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.x;
          local_380._4_4_ = (pSVar21->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.y;
          local_398 = (undefined1  [4])
                      (pSVar21->super_Interaction).n.super_Tuple3<pbrt::Normal3,_float>.z;
          IVar4 = (pSVar21->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
          local_378._0_4_ = (pSVar21->shading).n.super_Tuple3<pbrt::Normal3,_float>.x;
          local_378._4_4_ = (pSVar21->shading).n.super_Tuple3<pbrt::Normal3,_float>.y;
          local_368 = IVar4.low;
          fStack_364 = IVar4.high;
        }
        else {
          local_2f8 = pVVar28[(long)t + -1].field_2.ei.super_Interaction.pi.
                      super_Point3<pbrt::Interval<float>_>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x;
          IStack_2f0 = pVVar28[(long)t + -1].field_2.ei.super_Interaction.pi.
                       super_Point3<pbrt::Interval<float>_>.
                       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y;
          IVar4 = pVVar28[(long)t + -1].field_2.ei.super_Interaction.pi.
                  super_Point3<pbrt::Interval<float>_>.
                  super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z;
          local_370 = 0.0;
          local_378 = 0;
          local_380 = 0;
          auVar30._12_4_ = 0;
          auVar30._0_12_ = _auStack_394;
          _local_398 = auVar30 << 0x20;
          local_368 = IVar4.low;
          fStack_364 = IVar4.high;
        }
        uStack_35c = 0;
        uStack_360 = 0;
        uVar24 = (sampler->
                 super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                 ).bits;
        uVar23 = (uint)(ushort)(uVar24 >> 0x30);
        if (uVar24 >> 0x30 < 5) {
          if (uVar24 < 0x3000000000000) {
            if (uVar23 == 2) {
              auVar47._0_8_ =
                   PaddedSobolSampler::Get2D((PaddedSobolSampler *)(uVar24 & 0xffffffffffff));
              auVar47._8_56_ = extraout_var_06;
              auVar30 = auVar47._0_16_;
            }
            else {
              auVar56._0_8_ = HaltonSampler::Get2D((HaltonSampler *)(uVar24 & 0xffffffffffff));
              auVar56._8_56_ = extraout_var_12;
              auVar30 = auVar56._0_16_;
            }
          }
          else if ((uVar23 & 6) == 2) {
            auVar54._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)(uVar24 & 0xffffffffffff));
            auVar54._8_56_ = extraout_var_10;
            auVar30 = auVar54._0_16_;
          }
          else {
            auVar58._0_8_ = RandomSampler::Get2D((RandomSampler *)(uVar24 & 0xffffffffffff));
            auVar58._8_56_ = extraout_var_14;
            auVar30 = auVar58._0_16_;
          }
        }
        else {
          uVar23 = uVar23 - 4;
          if (uVar23 < 3) {
            if (uVar23 == 2) {
              auVar53._0_8_ =
                   StratifiedSampler::Get2D((StratifiedSampler *)(uVar24 & 0xffffffffffff));
              auVar53._8_56_ = extraout_var_09;
              auVar30 = auVar53._0_16_;
            }
            else {
              auVar57._0_8_ = SobolSampler::Get2D((SobolSampler *)(uVar24 & 0xffffffffffff));
              auVar57._8_56_ = extraout_var_13;
              auVar30 = auVar57._0_16_;
            }
          }
          else {
            pDVar29 = (DebugMLTSampler *)(uVar24 & 0xffffffffffff);
            if ((uVar23 & 0x7ffffffe) == 2) {
              auVar55._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar29);
              auVar55._8_56_ = extraout_var_11;
              auVar30 = auVar55._0_16_;
            }
            else {
              local_2b8 = DebugMLTSampler::Get1D(pDVar29);
              uStack_2b4 = extraout_XMM0_Db_00;
              uStack_2b0 = extraout_XMM0_Dc_00;
              uStack_2ac = extraout_XMM0_Dd_00;
              auVar59._0_4_ = DebugMLTSampler::Get1D(pDVar29);
              auVar59._4_60_ = extraout_var_00;
              auVar74._4_4_ = uStack_2b4;
              auVar74._0_4_ = local_2b8;
              auVar74._8_4_ = uStack_2b0;
              auVar74._12_4_ = uStack_2ac;
              auVar30 = vinsertps_avx(auVar74,auVar59._0_16_,0x10);
            }
          }
        }
        auVar9._4_4_ = fStack_364;
        auVar9._0_4_ = local_368;
        auVar9._8_4_ = uStack_360;
        auVar9._12_4_ = uStack_35c;
        puStack_2c0 = &local_2dc;
        local_2d8.state = (uint64_t)local_348;
        local_58 = *(undefined8 *)(local_3d8->lambda).values;
        uStack_50 = *(undefined8 *)((local_3d8->lambda).values + 2);
        uStack_48 = *(undefined8 *)(local_3d8->pdf).values;
        uStack_40 = *(undefined8 *)((local_3d8->pdf).values + 2);
        puStack_2c8 = &local_58;
        local_2dc = 1;
        local_348._0_4_ = local_2f8.low;
        local_348._4_4_ = local_2f8.high;
        uStack_340._0_4_ = IStack_2f0.low;
        uStack_340._4_4_ = IStack_2f0.high;
        uVar34 = vmovlps_avx(auVar9);
        fStack_338 = (float)uVar34;
        fStack_334 = (float)((ulong)uVar34 >> 0x20);
        fStack_330 = (float)local_380;
        FStack_32c = (Float)((ulong)local_380 >> 0x20);
        fStack_328 = (float)local_398;
        fStack_324 = (float)local_378;
        fStack_320 = (float)((ulong)local_378 >> 0x20);
        fStack_31c = local_370;
        local_2d8.inc = (uint64_t)&local_298;
        local_298 = vmovlps_avx(auVar30);
        local_290 = (anon_struct_8_0_00000001_for___align)uVar64;
        detail::DispatchSplit<9>::operator()(local_288,&local_3c9,&local_290,(ulong)uVar64 >> 0x30);
        pVVar1 = local_2e8;
        uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
        if (0.0 < (float)local_288._28_4_) {
          fVar33 = (float)local_288._28_4_ * local_36c;
          auVar13._8_8_ = local_288._8_8_;
          auVar13._0_8_ = local_288._0_8_;
          uStack_304 = (undefined4)local_288._104_8_;
          uStack_300 = SUB84(local_288._104_8_,4);
          local_74._8_4_ = 0.0;
          local_74[0xc] = false;
          local_74._0_5_ = 0;
          local_74._5_3_ = 0;
          local_1b8._0_4_ = Light;
          auVar36._4_4_ = fVar33;
          auVar36._0_4_ = fVar33;
          auVar36._8_4_ = fVar33;
          auVar36._12_4_ = fVar33;
          local_1b8._4_16_ = vdivps_avx(auVar13,auVar36);
          local_348._4_4_ = (undefined4)local_288._40_8_;
          uStack_340._0_4_ = SUB84(local_288._40_8_,4);
          uStack_340._4_4_ = (float)local_288._48_8_;
          fStack_338 = SUB84(local_288._48_8_,4);
          fStack_334 = (float)local_288._56_8_;
          fStack_330 = SUB84(local_288._56_8_,4);
          FStack_32c = (Float)local_288._64_8_;
          fStack_328 = SUB84(local_288._64_8_,4);
          fStack_324 = (float)local_288._72_8_;
          fStack_320 = SUB84(local_288._72_8_,4);
          fStack_31c = (float)local_288._80_8_;
          fStack_318 = SUB84(local_288._80_8_,4);
          fStack_314 = (float)local_288._88_8_;
          fStack_310 = SUB84(local_288._88_8_,4);
          fStack_30c = (float)local_288._96_8_;
          uStack_308 = SUB84(local_288._96_8_,4);
          local_1a0._64_8_ = local_288._104_8_;
          local_1b8._20_4_ = local_348._0_4_;
          local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = (float)local_348._4_4_;
          local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = (float)uStack_340;
          local_1a0.ei.super_Interaction.medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits = (MediumHandle)(MediumHandle)local_288._112_8_;
          local_1a0.ei.field_0 = (anon_union_8_2_4c55fc14_for_EndpointInteraction_1)uVar64;
          local_a0.
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
          .bits = (TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                   )0;
          local_98._0_4_ = 1.0;
          local_98._4_4_ = 0.0;
          local_98._8_4_ = 0.0;
          local_98._12_4_ = 0.0;
          uStack_88._0_4_ = 1.0;
          uStack_88._4_4_ = 0.0;
          TStack_80.x = 0.0;
          TStack_80.y = 0.0;
          TStack_80.z = 1.0;
          local_64._0_4_ = 0.0;
          local_64._4_4_ = 0.0;
          local_2a0.bits =
               (lightSampler->
               super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
               ).bits;
          auVar73 = ZEXT856((ulong)local_288._56_8_);
          local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = uStack_340._4_4_;
          local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high = fStack_338;
          local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low = fStack_334;
          local_1a0.ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high = fStack_330;
          local_1a0.ei.super_Interaction.time = FStack_32c;
          local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x = fStack_328;
          local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y = fStack_324;
          local_1a0.ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z = fStack_320;
          local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x = fStack_31c;
          local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y = fStack_318;
          local_1a0.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z = fStack_314;
          local_1a0.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x = fStack_310;
          local_1a0.ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y = fStack_30c;
          local_1a0._60_4_ = uStack_308;
          FVar32 = Vertex::PdfLightOrigin
                             ((Vertex *)local_1b8,&local_3c8->infiniteLights,local_2e8,
                              (LightSamplerHandle *)&local_2a0);
          local_64._0_4_ = FVar32;
          auVar62 = extraout_var_15;
          SVar75 = Vertex::f(pVVar1,(Vertex *)local_1b8,Radiance);
          TVar15.y = (float)local_348._4_4_;
          TVar15.x = (float)local_348._0_4_;
          auVar71._0_8_ = SVar75.values.values._8_8_;
          auVar71._8_56_ = auVar73;
          auVar60._0_8_ = SVar75.values.values._0_8_;
          auVar60._8_56_ = auVar62;
          auVar30 = vmovlhps_avx(auVar60._0_16_,auVar71._0_16_);
          fVar33 = auVar30._0_4_ * pVVar28[(long)t + -1].beta.values.values[0] *
                   (float)local_1b8._4_4_;
          afStack_3e4[0] =
               auVar30._4_4_ * pVVar28[(long)t + -1].beta.values.values[1] * (float)local_1b8._8_4_;
          afStack_3e4[1] =
               auVar30._8_4_ * pVVar28[(long)t + -1].beta.values.values[2] * (float)local_1b8._12_4_
          ;
          afStack_3e4[2] =
               auVar30._12_4_ * pVVar28[(long)t + -1].beta.values.values[3] *
               (float)local_1b8._16_4_;
          local_3e8 = (undefined1  [4])fVar33;
          if (((pVVar28[(long)t + -1].field_2.ei.super_Interaction.n.
                super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
              (fVar3 = pVVar28[(long)t + -1].field_2.ei.super_Interaction.n.
                       super_Tuple3<pbrt::Normal3,_float>.y, fVar3 != 0.0)) ||
             ((NAN(fVar3) ||
              ((fVar3 = pVVar28[(long)t + -1].field_2.ei.super_Interaction.n.
                        super_Tuple3<pbrt::Normal3,_float>.z, fVar3 != 0.0 || (NAN(fVar3))))))) {
            pNVar22 = &(pVVar1->field_2).ei.super_Interaction.n;
            if (pVVar1->type == Surface) {
              pNVar22 = (Normal3f *)((pVVar1->field_2).mi.sigma_maj.values.values + 2);
            }
            fVar3 = (pNVar22->super_Tuple3<pbrt::Normal3,_float>).z;
            auVar74 = ZEXT416((uint)(fVar3 * (float)local_288._24_4_));
            auVar30 = vfmadd132ss_fma(ZEXT416((uint)(pNVar22->super_Tuple3<pbrt::Normal3,_float>).y)
                                      ,auVar74,ZEXT416((uint)local_288._20_4_));
            auVar74 = vfmsub213ss_fma(ZEXT416((uint)local_288._24_4_),ZEXT416((uint)fVar3),auVar74);
            auVar30 = vfmadd231ss_fma(ZEXT416((uint)(auVar30._0_4_ + auVar74._0_4_)),
                                      ZEXT416((uint)(pNVar22->super_Tuple3<pbrt::Normal3,_float>).x)
                                      ,ZEXT416((uint)local_288._16_4_));
            uVar63 = auVar30._0_4_;
            auVar37._4_4_ = uVar63;
            auVar37._0_4_ = uVar63;
            auVar37._8_4_ = uVar63;
            auVar37._12_4_ = uVar63;
            auVar7._8_4_ = 0x7fffffff;
            auVar7._0_8_ = 0x7fffffff7fffffff;
            auVar7._12_4_ = 0x7fffffff;
            auVar30 = vandps_avx512vl(auVar37,auVar7);
            fVar33 = auVar30._0_4_ * fVar33;
            afStack_3e4[0] = auVar30._4_4_ * afStack_3e4[0];
            local_3e8 = (undefined1  [4])fVar33;
            afStack_3e4[1] = auVar30._8_4_ * afStack_3e4[1];
            afStack_3e4[2] = auVar30._12_4_ * afStack_3e4[2];
          }
          if ((fVar33 == 0.0) && (!NAN(fVar33))) {
            uVar24 = 0xffffffffffffffff;
            do {
              uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
              if (uVar24 == 2) goto LAB_004421fe;
              lVar26 = uVar24 * 4;
              uVar24 = uVar24 + 1;
            } while ((*(float *)(local_3e8 + lVar26 + 8) == 0.0) &&
                    (!NAN(*(float *)(local_3e8 + lVar26 + 8))));
            local_348 = (undefined1  [8])TVar15;
            uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
            if (2 < uVar24) goto LAB_004421fe;
          }
          auVar11._8_4_ = IStack_2f0.low;
          auVar11._12_4_ = IStack_2f0.high;
          auVar11._0_4_ = local_2f8.low;
          auVar11._4_4_ = local_2f8.high;
          auVar30 = vhaddps_avx(auVar11,auVar11);
          auVar74 = vmovshdup_avx(auVar30);
          auVar30 = vinsertps_avx(ZEXT416((uint)(auVar30._0_4_ * 0.5)),
                                  ZEXT416((uint)(auVar74._0_4_ * 0.5)),0x10);
          auVar62 = ZEXT856(auVar30._8_8_);
          auVar10._4_4_ = fStack_364;
          auVar10._0_4_ = local_368;
          auVar10._8_4_ = uStack_360;
          auVar10._12_4_ = uStack_35c;
          uVar24 = auVar30._0_8_ * -0x395b586ca42e166b;
          auVar30 = vhaddps_avx(auVar10,auVar10);
          auVar73 = (undefined1  [56])0x0;
          uVar24 = (CONCAT44((int)(uVar24 >> 0x20),auVar30._0_4_ * 0.5) ^
                   ((uVar24 >> 0x2f ^ uVar24) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
                   -0x395b586ca42e166b) * -0x395b586ca42e166b;
          uVar24 = (uVar24 >> 0x2f ^ uVar24) * -0x395b586ca42e166b;
          uVar24 = uVar24 >> 0x2f ^ uVar24;
          uVar27 = ((ulong)(uint)local_398 ^
                   (((ulong)(local_380 * -0x395b586ca42e166b) >> 0x2f ^
                    local_380 * -0x395b586ca42e166b) * -0x395b586ca42e166b ^ 0x4fb7dae84dd6f2fc) *
                   -0x395b586ca42e166b) * -0x395b586ca42e166b;
          uVar27 = (uVar27 >> 0x2f ^ uVar27) * -0x395b586ca42e166b;
          uStack_340 = uVar24 * 2 + 1;
          local_348 = (undefined1  [8])
                      (((uVar27 >> 0x2f ^ uVar27) + 1) * 0x5851f42d4c957f2d +
                       uVar24 * -0x4f5c17a566d501a4 + 1);
          SVar75 = Integrator::Tr(local_3c8,&pVVar28[(long)t + -1].field_2.ei.super_Interaction,
                                  (Interaction *)(local_288 + 0x28),local_3d8,(RNG *)local_348);
          auVar72._0_8_ = SVar75.values.values._8_8_;
          auVar72._8_56_ = auVar73;
          auVar74 = auVar72._0_16_;
          auVar61._0_8_ = SVar75.values.values._0_8_;
          auVar61._8_56_ = auVar62;
          auVar30 = auVar61._0_16_;
          goto LAB_004421ee;
        }
      }
    }
  }
  else {
    this.bits = (uintptr_t)(lightVertices + (long)s + -1);
    auVar62 = ZEXT856(0);
    auVar73 = ZEXT856(0);
    bVar18 = Vertex::IsConnectible((Vertex *)this.bits);
    pVVar1 = local_3c0;
    uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
    if (bVar18) {
      pVVar28 = local_3c0 + (long)t + -1;
      bVar18 = Vertex::IsConnectible(pVVar28);
      uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
      if (bVar18) {
        SVar75 = Vertex::f((Vertex *)this.bits,pVVar28,Importance);
        auVar66._0_8_ = SVar75.values.values._8_8_;
        auVar66._8_56_ = auVar73;
        auVar40._0_8_ = SVar75.values.values._0_8_;
        auVar40._8_56_ = auVar62;
        auVar30 = vmovlhps_avx(auVar40._0_16_,auVar66._0_16_);
        local_398 = (undefined1  [4])
                    (auVar30._0_4_ * lightVertices[(long)s + -1].beta.values.values[0]);
        auStack_394._0_4_ = auVar30._4_4_ * lightVertices[(long)s + -1].beta.values.values[1];
        auStack_394._4_4_ = auVar30._8_4_ * lightVertices[(long)s + -1].beta.values.values[2];
        fStack_38c = auVar30._12_4_ * lightVertices[(long)s + -1].beta.values.values[3];
        auVar62 = ZEXT856(local_398._8_8_);
        sampler_00.bits = this.bits;
        SVar75 = Vertex::f(pVVar28,(Vertex *)this.bits,Radiance);
        TVar16.y = (float)local_348._4_4_;
        TVar16.x = (float)local_348._0_4_;
        auVar67._0_8_ = SVar75.values.values._8_8_;
        auVar67._8_56_ = auVar73;
        auVar41._0_8_ = SVar75.values.values._0_8_;
        auVar41._8_56_ = auVar62;
        auVar30 = vmovlhps_avx(auVar41._0_16_,auVar67._0_16_);
        local_3e8 = (undefined1  [4])
                    (auVar30._0_4_ * (float)local_398 * pVVar1[(long)t + -1].beta.values.values[0]);
        afStack_3e4[0] =
             auVar30._4_4_ * (float)auStack_394._0_4_ * pVVar1[(long)t + -1].beta.values.values[1];
        afStack_3e4[1] =
             auVar30._8_4_ * (float)auStack_394._4_4_ * pVVar1[(long)t + -1].beta.values.values[2];
        afStack_3e4[2] = auVar30._12_4_ * fStack_38c * pVVar1[(long)t + -1].beta.values.values[3];
        auVar73 = ZEXT856(local_3e8._8_8_);
        auVar62 = ZEXT856(0);
        if (((float)local_3e8 == 0.0) && (!NAN((float)local_3e8))) {
          uVar24 = 0xffffffffffffffff;
          do {
            uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
            if (uVar24 == 2) goto LAB_004421fe;
            lVar26 = uVar24 * 4;
            auVar73 = (undefined1  [56])0x0;
            uVar24 = uVar24 + 1;
          } while ((*(float *)(local_3e8 + lVar26 + 8) == 0.0) &&
                  (!NAN(*(float *)(local_3e8 + lVar26 + 8))));
          local_348 = (undefined1  [8])TVar16;
          uStack_340 = CONCAT44(uStack_340._4_4_,(float)uStack_340);
          if (2 < uVar24) goto LAB_004421fe;
        }
        SVar75 = G(local_3c8,(SamplerHandle)sampler_00.bits,(Vertex *)this.bits,pVVar28,local_3d8);
        auVar68._0_8_ = SVar75.values.values._8_8_;
        auVar68._8_56_ = auVar73;
        auVar74 = auVar68._0_16_;
        auVar42._0_8_ = SVar75.values.values._0_8_;
        auVar42._8_56_ = auVar62;
        auVar30 = auVar42._0_16_;
        goto LAB_004421ee;
      }
    }
  }
LAB_004421fe:
  *(long *)(in_FS_OFFSET + -0x2b8) = *(long *)(in_FS_OFFSET + -0x2b8) + 1;
  if (((float)local_3e8 == 0.0) && (!NAN((float)local_3e8))) {
    uVar24 = 0xffffffffffffffff;
    do {
      if (uVar24 == 2) goto LAB_00442242;
      lVar26 = uVar24 * 4;
      uVar24 = uVar24 + 1;
    } while ((*(float *)(local_3e8 + lVar26 + 8) == 0.0) &&
            (!NAN(*(float *)(local_3e8 + lVar26 + 8))));
    if (2 < uVar24) {
LAB_00442242:
      *(long *)(in_FS_OFFSET + -0x2b0) = *(long *)(in_FS_OFFSET + -0x2b0) + 1;
    }
  }
  *(long *)(in_FS_OFFSET + -0x2a0) = *(long *)(in_FS_OFFSET + -0x2a0) + 1;
  lVar26 = (long)(s + -2 + t);
  *(long *)(in_FS_OFFSET + -0x2a8) = *(long *)(in_FS_OFFSET + -0x2a8) + lVar26;
  lVar25 = *(long *)(in_FS_OFFSET + -0x720);
  if (lVar26 <= *(long *)(in_FS_OFFSET + -0x720)) {
    lVar25 = lVar26;
  }
  if (lVar26 < *(long *)(in_FS_OFFSET + -0x718)) {
    lVar26 = *(long *)(in_FS_OFFSET + -0x718);
  }
  *(long *)(in_FS_OFFSET + -0x720) = lVar25;
  *(long *)(in_FS_OFFSET + -0x718) = lVar26;
  if (((float)local_3e8 != 0.0) || (NAN((float)local_3e8))) {
LAB_004422b2:
    local_2a8.bits =
         (lightSampler->
         super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
         ).bits;
    fVar33 = MISWeight(local_3c8,local_350,local_3c0,(Vertex *)local_1b8,s,t,
                       (LightSamplerHandle *)&local_2a8);
  }
  else {
    uVar24 = 0xffffffffffffffff;
    fVar33 = 0.0;
    do {
      if (uVar24 == 2) goto LAB_004422e7;
      lVar26 = uVar24 * 4;
      uVar24 = uVar24 + 1;
    } while ((*(float *)(local_3e8 + lVar26 + 8) == 0.0) &&
            (!NAN(*(float *)(local_3e8 + lVar26 + 8))));
    if (uVar24 < 3) goto LAB_004422b2;
  }
LAB_004422e7:
  afStack_3e4[0] = fVar33 * afStack_3e4[0];
  local_3e8 = (undefined1  [4])(fVar33 * (float)local_3e8);
  afStack_3e4[1] = fVar33 * afStack_3e4[1];
  afStack_3e4[2] = fVar33 * afStack_3e4[2];
  if (misWeightPtr != (Float *)0x0) {
    *misWeightPtr = fVar33;
  }
  auVar30 = *(undefined1 (*) [16])(local_3d8->pdf).values;
  uVar24 = vcmpps_avx512vl(auVar30,ZEXT416(0) << 0x20,4);
  auVar30 = vdivps_avx512vl(_local_3e8,auVar30);
  uVar34 = CONCAT44((uint)((byte)(uVar24 >> 1) & 1) * auVar30._4_4_,
                    (uint)((byte)uVar24 & 1) * auVar30._0_4_);
  auVar31._8_4_ = (uint)((byte)(uVar24 >> 2) & 1) * auVar30._8_4_;
  auVar31._0_8_ = uVar34;
  auVar31._12_4_ = (uint)((byte)(uVar24 >> 3) & 1) * auVar30._12_4_;
  auVar30 = vshufpd_avx(auVar31,auVar31,1);
  uVar64 = auVar30._0_8_;
LAB_00442327:
  SVar75.values.values[2] = (float)(int)uVar64;
  SVar75.values.values[3] = (float)(int)((ulong)uVar64 >> 0x20);
  SVar75.values.values[0] = (float)(int)uVar34;
  SVar75.values.values[1] = (float)(int)((ulong)uVar34 >> 0x20);
  return (SampledSpectrum)SVar75.values.values;
}

Assistant:

SampledSpectrum ConnectBDPT(const Integrator &integrator, SampledWavelengths &lambda,
                            Vertex *lightVertices, Vertex *cameraVertices, int s, int t,
                            LightSamplerHandle lightSampler, CameraHandle camera,
                            SamplerHandle sampler, pstd::optional<Point2f> *pRaster,
                            Float *misWeightPtr) {
    SampledSpectrum L(0.f);
    // Ignore invalid connections related to infinite area lights
    if (t > 1 && s != 0 && cameraVertices[t - 1].type == VertexType::Light)
        return SampledSpectrum(0.f);

    // Perform connection and write contribution to _L_
    Vertex sampled;
    if (s == 0) {
        // Interpret the camera subpath as a complete path
        const Vertex &pt = cameraVertices[t - 1];
        if (pt.IsLight())
            L = pt.Le(integrator.infiniteLights, cameraVertices[t - 2], lambda) * pt.beta;
        DCHECK(!L.HasNaNs());

    } else if (t == 1) {
        // Sample a point on the camera and connect it to the light subpath
        const Vertex &qs = lightVertices[s - 1];
        if (qs.IsConnectible()) {
            pstd::optional<CameraWiSample> cs =
                camera.SampleWi(qs.GetInteraction(), sampler.Get2D(), lambda);
            if (cs) {
                *pRaster = cs->pRaster;
                // Initialize dynamically sampled vertex and _L_ for $t=1$ case
                sampled = Vertex::CreateCamera(camera, cs->pLens, cs->Wi / cs->pdf);
                L = qs.beta * qs.f(sampled, TransportMode::Importance) * sampled.beta;
                if (qs.IsOnSurface())
                    L *= AbsDot(cs->wi, qs.ns());
                DCHECK(!L.HasNaNs());
                // Only check visibility after we know that the path would
                // make a non-zero contribution.
                if (L) {
                    RNG rng(Hash(cs->pRaster), Hash(cs->pLens));
                    L *= integrator.Tr(cs->pRef, cs->pLens, lambda, rng);
                }
            }
        }

    } else if (s == 1) {
        // Sample a point on a light and connect it to the camera subpath
        const Vertex &pt = cameraVertices[t - 1];
        if (pt.IsConnectible()) {
            pstd::optional<SampledLight> sampledLight =
                lightSampler.Sample(sampler.Get1D());

            if (sampledLight) {
                LightHandle light = sampledLight->light;
                Float lightPDF = sampledLight->pdf;

                LightSampleContext ctx;
                if (pt.IsOnSurface())
                    ctx = LightSampleContext(pt.GetInteraction().AsSurface());
                else
                    ctx = LightSampleContext(pt.GetInteraction());
                LightLiSample lightWeight = light.SampleLi(ctx, sampler.Get2D(), lambda);
                if (lightWeight) {
                    EndpointInteraction ei(lightWeight.pLight, light);
                    sampled = Vertex::CreateLight(
                        ei, lightWeight.L / (lightWeight.pdf * lightPDF), 0);
                    sampled.pdfFwd = sampled.PdfLightOrigin(integrator.infiniteLights, pt,
                                                            lightSampler);
                    L = pt.beta * pt.f(sampled, TransportMode::Radiance) * sampled.beta;
                    if (pt.IsOnSurface())
                        L *= AbsDot(lightWeight.wi, pt.ns());
                    // Only check visibility if the path would carry radiance.
                    if (L) {
                        RNG rng(Hash(ctx.p()), Hash(ctx.n));
                        L *= integrator.Tr(pt.GetInteraction(), lightWeight.pLight,
                                           lambda, rng);
                    }
                }
            }
        }

    } else {
        // Handle all other bidirectional connection cases
        const Vertex &qs = lightVertices[s - 1], &pt = cameraVertices[t - 1];
        if (qs.IsConnectible() && pt.IsConnectible()) {
            L = qs.beta * qs.f(pt, TransportMode::Importance) *
                pt.f(qs, TransportMode::Radiance) * pt.beta;
            PBRT_DBG("%s\n",
                     StringPrintf(
                         "General connect s: %d, t: %d, qs: %s, pt: %s, qs.f(pt): %s, "
                         "pt.f(qs): %s, G: %s, dist^2: %f",
                         s, t, qs, pt, qs.f(pt, TransportMode::Importance),
                         pt.f(qs, TransportMode::Radiance),
                         G(integrator, sampler, qs, pt, lambda),
                         DistanceSquared(qs.p(), pt.p()))
                         .c_str());
            if (L)
                L *= G(integrator, sampler, qs, pt, lambda);
        }
    }

    ++totalPaths;
    if (!L)
        ++zeroRadiancePaths;
    ReportValue(pathLength, s + t - 2);
    // Compute MIS weight for connection strategy
    Float misWeight = L ? MISWeight(integrator, lightVertices, cameraVertices, sampled, s,
                                    t, lightSampler)
                        : 0.f;
    PBRT_DBG("MIS weight for (s,t) = (%d, %d) connection: %f\n", s, t, misWeight);
    DCHECK(!IsNaN(misWeight));
    L *= misWeight;
    if (misWeightPtr != nullptr)
        *misWeightPtr = misWeight;

    return SafeDiv(L, lambda.PDF());
}